

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O1

void google::protobuf::
     STLDeleteValues<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
               (map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
                *v)

{
  _Rb_tree_node_base *p_Var1;
  
  if (v == (map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
            *)0x0) {
    return;
  }
  for (p_Var1 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(v->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
  ::clear(&v->_M_t);
  return;
}

Assistant:

void STLDeleteValues(T *v) {
  if (!v) return;
  for (typename T::iterator i = v->begin(); i != v->end(); ++i) {
    delete i->second;
  }
  v->clear();
}